

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueConverter.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsTorqueConverter::IntLoadResidual_F
          (ChShaftsTorqueConverter *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *pdVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  iVar5 = (*(this->shaft1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])
                    (this->shaft1,CONCAT44(in_register_00000034,off));
  if ((char)iVar5 != '\0') {
    uVar6 = (ulong)(this->shaft1->super_ChPhysicsItem).offset_w;
    if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)uVar6) goto LAB_005edd15;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = this->torque_in;
    pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = c;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pdVar3[uVar6];
    auVar7 = vfmadd213sd_fma(auVar8,auVar12,auVar7);
    pdVar3[uVar6] = auVar7._0_8_;
  }
  iVar5 = (*(this->shaft2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    uVar6 = (ulong)(this->shaft2->super_ChPhysicsItem).offset_w;
    if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)uVar6) goto LAB_005edd15;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this->torque_out;
    pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = c;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar3[uVar6];
    auVar7 = vfmadd213sd_fma(auVar9,auVar13,auVar1);
    pdVar3[uVar6] = auVar7._0_8_;
  }
  iVar5 = (*(this->shaft_stator->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    uVar6 = (ulong)(this->shaft_stator->super_ChPhysicsItem).offset_w;
    if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)uVar6) {
LAB_005edd15:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = this->torque_out;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar10,auVar4);
    pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pdVar3[uVar6];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar7._0_8_ - this->torque_in;
    auVar7 = vfmadd213sd_fma(auVar14,auVar11,auVar2);
    pdVar3[uVar6] = auVar7._0_8_;
  }
  return;
}

Assistant:

void ChShaftsTorqueConverter::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                                                ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                                                const double c           // a scaling factor
) {
    if (shaft1->IsActive())
        R(shaft1->GetOffset_w()) += torque_in * c;
    if (shaft2->IsActive())
        R(shaft2->GetOffset_w()) += torque_out * c;
    if (shaft_stator->IsActive())
        R(shaft_stator->GetOffset_w()) += GetTorqueReactionOnStator() * c;
}